

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstraintElem.hpp
# Opt level: O3

void __thiscall OpenMD::ConstraintElem::ConstraintElem(ConstraintElem *this,StuntDouble *sd)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  StuntDouble *pSVar2;
  SimpleTypeData<bool> *pSVar3;
  SimpleTypeData<bool> *__tmp;
  element_type *peVar4;
  SimpleTypeData<bool> *__tmp_1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  shared_ptr<OpenMD::GenericData> movingData;
  shared_ptr<OpenMD::GenericData> movedData;
  undefined1 local_79;
  SimpleTypeData<bool> *local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_70;
  undefined1 local_68 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  shared_ptr<OpenMD::GenericData> local_48;
  shared_ptr<OpenMD::GenericData> local_38;
  undefined1 local_28 [16];
  
  this->sd_ = sd;
  (this->moved_).super___shared_ptr<OpenMD::SimpleTypeData<bool>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->moved_).super___shared_ptr<OpenMD::SimpleTypeData<bool>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->moving_).super___shared_ptr<OpenMD::SimpleTypeData<bool>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->moving_).super___shared_ptr<OpenMD::SimpleTypeData<bool>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_78 = (SimpleTypeData<bool> *)local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"Moved","");
  StuntDouble::getPropertyByName((StuntDouble *)local_28,(string *)sd);
  if (local_78 != (SimpleTypeData<bool> *)local_68) {
    operator_delete(local_78,local_68._0_8_ + 1);
  }
  if ((_func_int **)local_28._0_8_ == (_func_int **)0x0) {
    local_78 = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<OpenMD::SimpleTypeData<bool>,std::allocator<OpenMD::SimpleTypeData<bool>>,char_const(&)[6]>
              (&_Stack_70,&local_78,(allocator<OpenMD::SimpleTypeData<bool>_> *)(local_68 + 0x10),
               (char (*) [6])"Moved");
    local_38.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Stack_70._M_pi;
    pSVar3 = local_78;
    local_78 = (SimpleTypeData<bool> *)0x0;
    _Stack_70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (this->moved_).super___shared_ptr<OpenMD::SimpleTypeData<bool>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = pSVar3;
    p_Var5 = (this->moved_).
             super___shared_ptr<OpenMD::SimpleTypeData<bool>,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    (this->moved_).super___shared_ptr<OpenMD::SimpleTypeData<bool>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         local_38.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi;
    if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
      if (_Stack_70._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_70._M_pi);
      }
      local_38.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (this->moved_).
             super___shared_ptr<OpenMD::SimpleTypeData<bool>,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    }
    pSVar2 = this->sd_;
    local_38.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         &((this->moved_).
           super___shared_ptr<OpenMD::SimpleTypeData<bool>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          super_GenericData;
    if (local_38.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_38.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_38.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_38.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_38.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    StuntDouble::addProperty(pSVar2,&local_38);
    if (local_38.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_38.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  else {
    peVar4 = (element_type *)
             __dynamic_cast(local_28._0_8_,&GenericData::typeinfo,&SimpleTypeData<bool>::typeinfo,0)
    ;
    p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (peVar4 != (element_type *)0x0) {
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_28._8_8_ ==
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      else {
        p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_28._8_8_;
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_28._8_8_ + 8) = *(_Atomic_word *)(local_28._8_8_ + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(local_28._8_8_ + 8) = *(_Atomic_word *)(local_28._8_8_ + 8) + 1;
        }
      }
    }
    (this->moved_).super___shared_ptr<OpenMD::SimpleTypeData<bool>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = peVar4;
    p_Var1 = (this->moved_).
             super___shared_ptr<OpenMD::SimpleTypeData<bool>,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    (this->moved_).super___shared_ptr<OpenMD::SimpleTypeData<bool>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var5;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
      peVar4 = (this->moved_).
               super___shared_ptr<OpenMD::SimpleTypeData<bool>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    }
    if (peVar4 == (element_type *)0x0) {
      memcpy(&painCave,
             "Generic Data with keyword Moved exists, however, it can not be casted to a BoolGenericData.\n"
             ,0x5d);
      painCave.isFatal = 1;
      simError();
    }
  }
  pSVar2 = this->sd_;
  local_78 = (SimpleTypeData<bool> *)local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"Moving","");
  StuntDouble::getPropertyByName((StuntDouble *)(local_68 + 0x10),(string *)pSVar2);
  if (local_78 != (SimpleTypeData<bool> *)local_68) {
    operator_delete(local_78,local_68._0_8_ + 1);
  }
  if (local_68._16_8_ == 0) {
    local_78 = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<OpenMD::SimpleTypeData<bool>,std::allocator<OpenMD::SimpleTypeData<bool>>,char_const(&)[7]>
              (&_Stack_70,&local_78,(allocator<OpenMD::SimpleTypeData<bool>_> *)&local_79,
               (char (*) [7])"Moving");
    local_48.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Stack_70._M_pi;
    pSVar3 = local_78;
    local_78 = (SimpleTypeData<bool> *)0x0;
    _Stack_70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (this->moving_).super___shared_ptr<OpenMD::SimpleTypeData<bool>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = pSVar3;
    p_Var5 = (this->moving_).
             super___shared_ptr<OpenMD::SimpleTypeData<bool>,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    (this->moving_).super___shared_ptr<OpenMD::SimpleTypeData<bool>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         local_48.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi;
    if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
      if (_Stack_70._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_70._M_pi);
      }
      local_48.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (this->moving_).
             super___shared_ptr<OpenMD::SimpleTypeData<bool>,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    }
    pSVar2 = this->sd_;
    local_48.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         &((this->moving_).
           super___shared_ptr<OpenMD::SimpleTypeData<bool>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          super_GenericData;
    if (local_48.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_48.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_48.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_48.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_48.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    StuntDouble::addProperty(pSVar2,&local_48);
    if (local_48.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_48.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  else {
    peVar4 = (element_type *)
             __dynamic_cast(local_68._16_8_,&GenericData::typeinfo,&SimpleTypeData<bool>::typeinfo,0
                           );
    p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (peVar4 != (element_type *)0x0) {
      if (local_50 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      else {
        p_Var5 = local_50;
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_50->_M_use_count = local_50->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_50->_M_use_count = local_50->_M_use_count + 1;
        }
      }
    }
    (this->moving_).super___shared_ptr<OpenMD::SimpleTypeData<bool>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = peVar4;
    p_Var1 = (this->moving_).
             super___shared_ptr<OpenMD::SimpleTypeData<bool>,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    (this->moving_).super___shared_ptr<OpenMD::SimpleTypeData<bool>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var5;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
      peVar4 = (this->moving_).
               super___shared_ptr<OpenMD::SimpleTypeData<bool>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    }
    if (peVar4 == (element_type *)0x0) {
      memcpy(&painCave,
             "Generic Data with keyword Moving exists, however, it can not be casted to a BoolGenericData.\n"
             ,0x5e);
      painCave.isFatal = 1;
      simError();
    }
  }
  if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_28._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_28._8_8_);
  }
  return;
}

Assistant:

ConstraintElem(StuntDouble* sd) : sd_(sd) {
      std::shared_ptr<GenericData> movedData = sd_->getPropertyByName("Moved");
      if (movedData != nullptr) {  // if generic data with keyword "moved"
                                   // exists, assign it to moved_
        moved_ = std::dynamic_pointer_cast<BoolGenericData>(movedData);
        if (moved_ == nullptr) {
          snprintf(
              painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
              "Generic Data with keyword Moved exists, however, it can not "
              "be casted to a BoolGenericData.\n");
          painCave.isFatal = 1;
          ;
          simError();
        }
      } else {  // if generic data with keyword "moved" does not exist, create
                // it
        moved_ = std::make_shared<BoolGenericData>("Moved");
        sd_->addProperty(moved_);
      }

      std::shared_ptr<GenericData> movingData =
          sd_->getPropertyByName("Moving");
      if (movingData != nullptr) {
        moving_ = std::dynamic_pointer_cast<BoolGenericData>(movingData);
        if (moving_ == nullptr) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "Generic Data with keyword Moving exists, however, it can "
                   "not be casted to a BoolGenericData.\n");
          painCave.isFatal = 1;
          ;
          simError();
        }
      } else {
        moving_ = std::make_shared<BoolGenericData>("Moving");
        sd_->addProperty(moving_);
      }
    }